

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void * lj_mem_grow(lua_State *L,void *p,MSize *szp,MSize lim,MSize esz)

{
  void *pvVar1;
  undefined4 local_2c;
  MSize sz;
  MSize esz_local;
  MSize lim_local;
  MSize *szp_local;
  void *p_local;
  lua_State *L_local;
  
  local_2c = *szp << 1;
  if (local_2c < 8) {
    local_2c = 8;
  }
  if (lim < local_2c) {
    local_2c = lim;
  }
  pvVar1 = lj_mem_realloc(L,p,(ulong)(*szp * esz),(ulong)(local_2c * esz));
  *szp = local_2c;
  return pvVar1;
}

Assistant:

void *lj_mem_grow(lua_State *L, void *p, MSize *szp, MSize lim, MSize esz)
{
  MSize sz = (*szp) << 1;
  if (sz < LJ_MIN_VECSZ)
    sz = LJ_MIN_VECSZ;
  if (sz > lim)
    sz = lim;
  p = lj_mem_realloc(L, p, (*szp)*esz, sz*esz);
  *szp = sz;
  return p;
}